

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upath.c
# Opt level: O1

ALLEGRO_PATH * get_executable_name(void)

{
  char cVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  ALLEGRO_PATH *pAVar8;
  FILE *__stream;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  ALLEGRO_USTR *us;
  size_t sVar12;
  ALLEGRO_USTR *us_00;
  int iVar13;
  ALLEGRO_PATH *unaff_R12;
  stat finfo_1;
  char linkname [1024];
  char filename [1024];
  stat finfo;
  char command [1024];
  ALLEGRO_USTR_INFO AStack_d68;
  stat local_d58;
  char local_cc8 [1024];
  char local_8c8 [1024];
  stat local_4c8;
  char local_438 [1032];
  
  uVar4 = getpid();
  sprintf(local_cc8,"/proc/%d/exe",(ulong)uVar4);
  iVar5 = stat(local_cc8,&local_4c8);
  if (iVar5 == 0) {
    sVar7 = readlink(local_cc8,local_8c8,0x3ff);
    if (-1 < (int)(uint)sVar7) {
      local_8c8[(uint)sVar7 & 0x7fffffff] = '\0';
      pAVar8 = al_create_path(local_8c8);
      return pAVar8;
    }
  }
  sprintf(local_438,"ps -p %d",(ulong)uVar4);
  __stream = popen(local_438,"r");
  if (__stream == (FILE *)0x0) {
    pcVar9 = "";
    goto LAB_00188a7a;
  }
  pcVar9 = fgets(local_cc8,0x400,__stream);
  if ((pcVar9 == (char *)0x0) &&
     (_Var3 = _al_trace_prefix("upath",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/unix/upath.c"
                               ,0xd1,"get_executable_name"), _Var3)) {
    _al_trace_suffix("Failed to read the name of the executable file.\n");
  }
  sVar10 = strlen(local_cc8);
  pcVar9 = local_cc8 + (int)sVar10;
  while( true ) {
    iVar5 = (int)sVar10;
    if ((*pcVar9 == '\t') || (*pcVar9 == ' ')) break;
    pcVar9 = pcVar9 + -1;
    sVar10 = (size_t)(iVar5 - 1);
  }
  pcVar11 = fgets(local_cc8,0x400,__stream);
  if ((pcVar11 == (char *)0x0) &&
     (_Var3 = _al_trace_prefix("upath",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/unix/upath.c"
                               ,0xdb,"get_executable_name"), _Var3)) {
    _al_trace_suffix("Failed to read the name of the executable file.\n");
  }
  pclose(__stream);
  cVar1 = *pcVar9;
  iVar13 = (uint)(cVar1 == '-') + iVar5;
  if ((local_cc8[iVar13] == '[') && (sVar10 = strlen(local_cc8), local_cc8[sVar10] == ']')) {
    iVar13 = (uint)(cVar1 == '-') + iVar5 + 1;
    local_cc8[sVar10] = '\0';
  }
  sVar10 = strlen(local_cc8);
  pcVar9 = local_8c8;
  _al_sane_strncpy(pcVar9,local_cc8 + (long)iVar13 + 1,(sVar10 - (long)iVar13) + 1);
  pcVar11 = strchr(pcVar9,0x2f);
  if (pcVar11 == (char *)0x0) {
    pcVar11 = getenv("PATH");
    if (pcVar11 != (char *)0x0) {
      us = al_ustr_new(pcVar11);
      pAVar8 = unaff_R12;
      iVar5 = 0;
      do {
        iVar13 = iVar5;
        if (iVar13 < 0) {
          al_ustr_free(us);
          unaff_R12 = pAVar8;
          break;
        }
        iVar5 = al_ustr_find_chr(us,iVar13 + 1,0x3a);
        iVar6 = iVar5;
        if (iVar5 < 0) {
          sVar12 = al_ustr_size(us);
          iVar6 = (int)sVar12;
        }
        us_00 = al_ref_ustr(&AStack_d68,us,iVar13,iVar6);
        pcVar11 = al_cstr(us_00);
        unaff_R12 = al_create_path_for_directory(pcVar11);
        al_set_path_filename(unaff_R12,local_8c8);
        pcVar11 = al_path_cstr(unaff_R12,'/');
        iVar6 = stat(pcVar11,&local_d58);
        if ((iVar6 == 0) && ((local_d58.st_mode & 0xf000) != 0x4000)) {
          al_ustr_free(us);
          bVar2 = false;
          iVar5 = iVar13;
        }
        else {
          al_destroy_path(unaff_R12);
          bVar2 = true;
          unaff_R12 = pAVar8;
        }
        pAVar8 = unaff_R12;
      } while (bVar2);
      if (-1 < iVar13) goto LAB_00188a75;
    }
LAB_00188a72:
    unaff_R12 = (ALLEGRO_PATH *)0x0;
  }
  else if (local_8c8[0] == '/') {
    unaff_R12 = al_create_path(local_8c8);
  }
  else {
    pcVar11 = al_get_current_directory();
    bVar2 = true;
    if (pcVar11 != (char *)0x0) {
      unaff_R12 = al_create_path_for_directory(pcVar11);
      al_free_with_context
                (pcVar11,0x47,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/unix/upath.c"
                 ,"_find_executable_file");
      al_set_path_filename(unaff_R12,local_8c8);
      pcVar11 = al_path_cstr(unaff_R12,'/');
      iVar5 = stat(pcVar11,&local_d58);
      if ((iVar5 == 0) && ((local_d58.st_mode & 0xf000) != 0x4000)) {
        bVar2 = false;
      }
      else {
        al_destroy_path(unaff_R12);
      }
    }
    if (bVar2) goto LAB_00188a72;
  }
LAB_00188a75:
  if (unaff_R12 != (ALLEGRO_PATH *)0x0) {
    return unaff_R12;
  }
LAB_00188a7a:
  pAVar8 = al_create_path(pcVar9);
  return pAVar8;
}

Assistant:

static ALLEGRO_PATH *get_executable_name(void)
{
   ALLEGRO_PATH *path;

   #ifdef ALLEGRO_HAVE_GETEXECNAME
   {
      const char *s = getexecname();
      if (s) {
         if (s[0] == '/') {   /* Absolute path */
            return al_create_path(s);
         }
         else {               /* Not an absolute path */
            path = _find_executable_file(s);
            if (path)
               return path;
         }
      }
   }
   #endif

   /* We need the PID in order to query procfs */
   pid_t pid = getpid();

   /* Try a Linux-like procfs */   
   /* get symolic link to executable from proc fs */
   char linkname[1024];
   char filename[1024];
   struct stat finfo;
   sprintf(linkname, "/proc/%d/exe", (int)pid);
   if (stat(linkname, &finfo) == 0) {
      int len = readlink(linkname, filename, sizeof(filename) - 1);
      if (len > -1) {
         filename[len] = '\0';
         return al_create_path(filename);
      }
   }

   /* Use System V procfs calls if available */
#ifdef ALLEGRO_HAVE_SV_PROCFS_H
   struct prpsinfo psinfo;
   int fd;
   sprintf(linkname, "/proc/%d/exe", (int)pid);
   fd = open(linkname, O_RDONLY);
   if (fd != -1) {
      ioctl(fd, PIOCPSINFO, &psinfo);
      close(fd);
   
      /* Use argv[0] directly if we can */
#ifdef ALLEGRO_HAVE_PROCFS_ARGCV
      if (psinfo.pr_argv && psinfo.pr_argc) {
          path = _find_executable_file(psinfo.pr_argv[0]);
          if (path)
            return path;
      }
      else
#endif
      {
         /* Emulate it */
         /* We use the pr_psargs field to find argv[0]
          * This is better than using the pr_fname field because we need
          * the additional path information that may be present in argv[0]
          */
    
         /* Skip other args */
         char *s = strchr(psinfo.pr_psargs, ' ');
         if (s)
            s[0] = '\0';
         path = _find_executable_file(psinfo.pr_psargs);
         if (path)
            return path;
      }
   
      /* Try the pr_fname just for completeness' sake if argv[0] fails */
      path = _find_executable_file(psinfo.pr_fname);
      if (path)
         return path;
   }
#endif

   /* Last resort: try using the output of the ps command to at least find */
   /* the name of the file if not the full path */
   char command[1024];
   sprintf(command, "ps -p %d", (int)pid);
   FILE *pipe = popen(command, "r");
   if (pipe) {
      char* ret;
      /* The first line of output is a header */
      ret = fgets(linkname, sizeof(linkname), pipe);
      if (!ret)
         ALLEGRO_ERROR("Failed to read the name of the executable file.\n");
      
      /* The information we want is in the last column; find it */
      int len = strlen(linkname);
      while (linkname[len] != ' ' && linkname[len] != '\t')
         len--;

      /* The second line contains the info we want */
      ret = fgets(linkname, sizeof(linkname), pipe);
      if (!ret)
         ALLEGRO_ERROR("Failed to read the name of the executable file.\n");
      pclose(pipe);

      /* Treat special cases: filename between [] and - for login shell */
      if (linkname[len] == '-')
         len++;

      if (linkname[len] == '[' && linkname[strlen(linkname)] == ']') {
         len++;
         linkname[strlen(linkname)] = '\0';
      }         
      
      /* Now, the filename should be in the last column */
      _al_sane_strncpy(filename, linkname+len+1, strlen(linkname)-len+1);

      path = _find_executable_file(filename);
      if (path)
         return path;

      /* Just return the output from ps... */         
      return al_create_path(filename);
   }

   /* Give up; return empty string */
   return al_create_path("");
}